

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistence_lanscapes_on_grid_test.cpp
# Opt level: O0

void __thiscall
check_construction_of_landscape_using_only_ten_levels::test_method
          (check_construction_of_landscape_using_only_ten_levels *this)

{
  double a;
  double b;
  undefined8 uVar1;
  bool bVar2;
  unsigned_short uVar3;
  size_type sVar4;
  size_type sVar5;
  lazy_ostream *prev;
  reference pvVar6;
  double epsilon;
  size_type local_150;
  size_t i;
  basic_cstring<const_char> local_138;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_128;
  assertion_result local_108;
  basic_cstring<const_char> local_f0;
  basic_cstring<const_char> local_e0;
  undefined1 local_d0 [8];
  vector<double,_std::allocator<double>_> v2;
  vector<double,_std::allocator<double>_> v1;
  size_t level;
  undefined1 local_88 [8];
  Persistence_landscape_on_grid g;
  Persistence_landscape_on_grid l;
  uint number;
  check_construction_of_landscape_using_only_ten_levels *this_local;
  
  uVar3 = std::numeric_limits<unsigned_short>::max();
  Gudhi::Persistence_representations::Persistence_landscape_on_grid::Persistence_landscape_on_grid
            ((Persistence_landscape_on_grid *)&g.number_of_functions_for_projections_to_reals,
             "data/file_with_diagram_1",100,10,uVar3);
  uVar3 = std::numeric_limits<unsigned_short>::max();
  Gudhi::Persistence_representations::Persistence_landscape_on_grid::Persistence_landscape_on_grid
            ((Persistence_landscape_on_grid *)local_88,"data/file_with_diagram_1",100,uVar3);
  for (v1.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage = (pointer)0x0;
      v1.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage != (pointer)0xa;
      v1.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage =
           (pointer)((long)v1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage + 1)) {
    Gudhi::Persistence_representations::Persistence_landscape_on_grid::vectorize
              ((vector<double,_std::allocator<double>_> *)
               &v2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,
               (Persistence_landscape_on_grid *)&g.number_of_functions_for_projections_to_reals,
               (int)v1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
    Gudhi::Persistence_representations::Persistence_landscape_on_grid::vectorize
              ((vector<double,_std::allocator<double>_> *)local_d0,
               (Persistence_landscape_on_grid *)local_88,
               (int)v1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
    do {
      uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_e0,
                 "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_representations/test/persistence_lanscapes_on_grid_test.cpp"
                 ,0x91);
      boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_f0);
      boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_e0,0x2d,&local_f0);
      sVar4 = std::vector<double,_std::allocator<double>_>::size
                        ((vector<double,_std::allocator<double>_> *)
                         &v2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
      sVar5 = std::vector<double,_std::allocator<double>_>::size
                        ((vector<double,_std::allocator<double>_> *)local_d0);
      boost::test_tools::assertion_result::assertion_result(&local_108,sVar4 == sVar5);
      prev = boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_138,"v1.size() == v2.size()",0x16);
      boost::unit_test::operator<<(&local_128,prev,&local_138);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)&i,
                 "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_representations/test/persistence_lanscapes_on_grid_test.cpp"
                 ,0x91);
      boost::test_tools::tt_detail::report_assertion(&local_108,&local_128,&i,0x2d,1,0,0);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl(&local_128);
      boost::test_tools::assertion_result::~assertion_result(&local_108);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    local_150 = 0;
    while( true ) {
      sVar4 = std::vector<double,_std::allocator<double>_>::size
                        ((vector<double,_std::allocator<double>_> *)
                         &v2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
      if (local_150 == sVar4) break;
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)
                          &v2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage,local_150);
      a = *pvVar6;
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)local_d0,local_150);
      b = *pvVar6;
      epsilon = std::numeric_limits<double>::epsilon();
      GUDHI_TEST_FLOAT_EQUALITY_CHECK<double>(a,b,epsilon);
      local_150 = local_150 + 1;
    }
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)local_d0);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)
               &v2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  }
  Gudhi::Persistence_representations::Persistence_landscape_on_grid::~Persistence_landscape_on_grid
            ((Persistence_landscape_on_grid *)local_88);
  Gudhi::Persistence_representations::Persistence_landscape_on_grid::~Persistence_landscape_on_grid
            ((Persistence_landscape_on_grid *)&g.number_of_functions_for_projections_to_reals);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(check_construction_of_landscape_using_only_ten_levels) {
  // TODO
  unsigned number = 10;
  Persistence_landscape_on_grid l("data/file_with_diagram_1", 100, number);
  Persistence_landscape_on_grid g("data/file_with_diagram_1", 100, std::numeric_limits<unsigned short>::max());
  // cut all the elements of order > 10 in g.

  for (size_t level = 0; level != number; ++level) {
    std::vector<double> v1 = l.vectorize(level);
    std::vector<double> v2 = g.vectorize(level);
    BOOST_CHECK(v1.size() == v2.size());
    for (size_t i = 0; i != v1.size(); ++i) {
      GUDHI_TEST_FLOAT_EQUALITY_CHECK(v1[i], v2[i]);
    }
  }
}